

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

int __thiscall
testing::internal::UnitTestImpl::FilterTests(UnitTestImpl *this,ReactionToSharding shard_tests)

{
  bool bVar1;
  bool bVar2;
  reference ppTVar3;
  char *__s;
  string *psVar4;
  vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_> *this_00;
  reference ppTVar5;
  int in_ESI;
  long in_RDI;
  string *in_stack_00000038;
  string *in_stack_00000040;
  bool is_selected;
  bool is_in_another_shard;
  bool is_runnable;
  bool matches_filter;
  bool is_disabled;
  string test_name;
  TestInfo *test_info;
  size_t j;
  string *test_suite_name;
  TestSuite *test_suite;
  iterator __end2;
  iterator __begin2;
  vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_> *__range2;
  int num_selected_tests;
  int num_runnable_tests;
  int32_t shard_index;
  int32_t total_shards;
  undefined7 in_stack_fffffffffffffee8;
  undefined1 in_stack_fffffffffffffeef;
  TestSuite *in_stack_fffffffffffffef0;
  byte local_107;
  byte local_106;
  bool local_105;
  bool local_102;
  string *name_str;
  allocator<char> *in_stack_ffffffffffffff20;
  undefined8 in_stack_ffffffffffffff30;
  int32_t default_val;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  allocator<char> local_b1;
  string local_b0 [32];
  value_type local_90;
  string *local_88;
  undefined1 local_69 [33];
  undefined1 *local_48;
  TestSuite *local_40;
  TestSuite **local_38;
  __normal_iterator<testing::TestSuite_**,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>
  local_30;
  long local_28;
  int local_1c;
  int local_18;
  int32_t local_14;
  int32_t local_10;
  int local_c;
  
  default_val = (int32_t)((ulong)in_stack_ffffffffffffff30 >> 0x20);
  local_c = in_ESI;
  if (in_ESI == 0) {
    local_10 = Int32FromEnvOrDie((char *)CONCAT44(in_stack_ffffffffffffff3c,
                                                  in_stack_ffffffffffffff38),default_val);
  }
  else {
    local_10 = -1;
  }
  if (local_c == 0) {
    local_14 = Int32FromEnvOrDie((char *)CONCAT44(local_10,in_stack_ffffffffffffff38),default_val);
  }
  else {
    local_14 = -1;
  }
  local_18 = 0;
  local_1c = 0;
  local_28 = in_RDI + 0xb8;
  local_30._M_current =
       (TestSuite **)
       std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>::begin
                 ((vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_> *)
                  CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8));
  local_38 = (TestSuite **)
             std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>::end
                       ((vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_> *)
                        CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8));
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<testing::TestSuite_**,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>
                        *)in_stack_fffffffffffffef0,
                       (__normal_iterator<testing::TestSuite_**,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>
                        *)CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8));
    if (!bVar1) break;
    ppTVar3 = __gnu_cxx::
              __normal_iterator<testing::TestSuite_**,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>
              ::operator*(&local_30);
    local_40 = *ppTVar3;
    __s = TestSuite::name((TestSuite *)0x19a287);
    this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_69;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(this_01,__s,in_stack_ffffffffffffff20);
    std::allocator<char>::~allocator((allocator<char> *)local_69);
    local_48 = local_69 + 1;
    TestSuite::set_should_run(local_40,false);
    local_88 = (string *)0x0;
    while( true ) {
      name_str = local_88;
      in_stack_ffffffffffffff20 = (allocator<char> *)TestSuite::test_info_list(local_40);
      psVar4 = (string *)
               std::vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>::size
                         ((vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_> *)
                          in_stack_ffffffffffffff20);
      if (psVar4 <= name_str) break;
      this_00 = TestSuite::test_info_list(local_40);
      ppTVar5 = std::vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>::operator[]
                          (this_00,(size_type)local_88);
      local_90 = *ppTVar5;
      TestInfo::name((TestInfo *)0x19a36b);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(this_01,__s,in_stack_ffffffffffffff20);
      std::allocator<char>::~allocator(&local_b1);
      bVar1 = UnitTestOptions::MatchesFilter(name_str,(char *)this_00);
      local_102 = true;
      if (!bVar1) {
        local_102 = UnitTestOptions::MatchesFilter(name_str,(char *)this_00);
      }
      local_90->is_disabled_ = local_102;
      bVar1 = UnitTestOptions::FilterMatchesTest(in_stack_00000040,in_stack_00000038);
      local_90->matches_filter_ = bVar1;
      if (((FLAGS_gtest_also_run_disabled_tests & 1) != 0) ||
         (local_105 = false, local_102 == false)) {
        local_105 = bVar1;
      }
      local_106 = 0;
      if (local_c != 1) {
        bVar1 = ShouldRunTestOnShard(local_10,local_14,local_18);
        local_106 = bVar1 ^ 0xff;
      }
      local_90->is_in_another_shard_ = (bool)(local_106 & 1);
      local_107 = 0;
      if (local_105 != false) {
        local_107 = local_106 & 1 ^ 0xff;
      }
      bVar1 = (bool)(local_107 & 1);
      local_18 = local_18 + (uint)local_105;
      local_1c = local_1c + (uint)bVar1;
      local_90->should_run_ = bVar1;
      in_stack_fffffffffffffef0 = local_40;
      bVar2 = TestSuite::should_run(local_40);
      in_stack_fffffffffffffeef = true;
      if (!bVar2) {
        in_stack_fffffffffffffeef = bVar1;
      }
      TestSuite::set_should_run(in_stack_fffffffffffffef0,(bool)in_stack_fffffffffffffeef);
      std::__cxx11::string::~string(local_b0);
      local_88 = (string *)&local_88->field_0x1;
    }
    std::__cxx11::string::~string((string *)(local_69 + 1));
    __gnu_cxx::
    __normal_iterator<testing::TestSuite_**,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>
    ::operator++(&local_30);
  }
  return local_1c;
}

Assistant:

int UnitTestImpl::FilterTests(ReactionToSharding shard_tests) {
  const int32_t total_shards = shard_tests == HONOR_SHARDING_PROTOCOL ?
      Int32FromEnvOrDie(kTestTotalShards, -1) : -1;
  const int32_t shard_index = shard_tests == HONOR_SHARDING_PROTOCOL ?
      Int32FromEnvOrDie(kTestShardIndex, -1) : -1;

  // num_runnable_tests are the number of tests that will
  // run across all shards (i.e., match filter and are not disabled).
  // num_selected_tests are the number of tests to be run on
  // this shard.
  int num_runnable_tests = 0;
  int num_selected_tests = 0;
  for (auto* test_suite : test_suites_) {
    const std::string& test_suite_name = test_suite->name();
    test_suite->set_should_run(false);

    for (size_t j = 0; j < test_suite->test_info_list().size(); j++) {
      TestInfo* const test_info = test_suite->test_info_list()[j];
      const std::string test_name(test_info->name());
      // A test is disabled if test suite name or test name matches
      // kDisableTestFilter.
      const bool is_disabled = internal::UnitTestOptions::MatchesFilter(
                                   test_suite_name, kDisableTestFilter) ||
                               internal::UnitTestOptions::MatchesFilter(
                                   test_name, kDisableTestFilter);
      test_info->is_disabled_ = is_disabled;

      const bool matches_filter = internal::UnitTestOptions::FilterMatchesTest(
          test_suite_name, test_name);
      test_info->matches_filter_ = matches_filter;

      const bool is_runnable =
          (GTEST_FLAG(also_run_disabled_tests) || !is_disabled) &&
          matches_filter;

      const bool is_in_another_shard =
          shard_tests != IGNORE_SHARDING_PROTOCOL &&
          !ShouldRunTestOnShard(total_shards, shard_index, num_runnable_tests);
      test_info->is_in_another_shard_ = is_in_another_shard;
      const bool is_selected = is_runnable && !is_in_another_shard;

      num_runnable_tests += is_runnable;
      num_selected_tests += is_selected;

      test_info->should_run_ = is_selected;
      test_suite->set_should_run(test_suite->should_run() || is_selected);
    }
  }
  return num_selected_tests;
}